

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::CustomDataSource::MergeFrom(CustomDataSource *this,CustomDataSource *from)

{
  uint uVar1;
  LogMessage *this_00;
  ArenaStringPtr *this_01;
  long in_RSI;
  long in_RDI;
  uint32 cached_has_bits;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  LogMessage *in_stack_fffffffffffffef0;
  ArenaStringPtr in_stack_ffffffffffffff00;
  string local_b8;
  long local_80;
  LogMessage *local_70;
  ArenaStringPtr *local_68;
  undefined4 local_5c;
  uint *local_58;
  undefined4 local_4c;
  uint *local_48;
  undefined4 local_3c;
  uint *local_38;
  LogMessage *local_30;
  LogMessage *local_28;
  Container *local_20;
  LogMessage *local_18;
  LogMessage *local_10;
  LogMessage *local_8;
  
  local_80 = in_RSI;
  if (in_RSI == in_RDI) {
    in_stack_ffffffffffffff00.ptr_ = &local_b8;
    google::protobuf::internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    google::protobuf::internal::LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    google::protobuf::internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x1c79bb);
  }
  this_01 = (ArenaStringPtr *)(in_RDI + 8);
  this_00 = (LogMessage *)(local_80 + 8);
  local_70 = this_00;
  local_68 = this_01;
  local_30 = this_00;
  local_8 = this_00;
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    local_28 = this_00;
    local_18 = this_00;
    local_10 = this_00;
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
      in_stack_fffffffffffffef0 = this_00;
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
      in_stack_fffffffffffffef0 = this_00;
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffee0,
               (UnknownFieldSet *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  google::protobuf::RepeatedPtrField<bloaty::Regex>::MergeFrom
            ((RepeatedPtrField<bloaty::Regex> *)in_stack_fffffffffffffee0,
             (RepeatedPtrField<bloaty::Regex> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_38 = (uint *)(local_80 + 0x10);
  local_3c = 0;
  uVar1 = *local_38;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      local_48 = (uint *)(in_RDI + 0x10);
      local_4c = 0;
      *local_48 = *local_48 | 1;
      google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (this_01,(string *)in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
    }
    if ((uVar1 & 2) != 0) {
      local_58 = (uint *)(in_RDI + 0x10);
      local_5c = 0;
      *local_58 = *local_58 | 2;
      google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (this_01,(string *)in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
    }
  }
  return;
}

Assistant:

void CustomDataSource::MergeFrom(const CustomDataSource& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:bloaty.CustomDataSource)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  rewrite_.MergeFrom(from.rewrite_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _has_bits_[0] |= 0x00000001u;
      name_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      _has_bits_[0] |= 0x00000002u;
      base_data_source_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.base_data_source_);
    }
  }
}